

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

void Zyx_ManFree(Zyx_Man_t *p)

{
  Vec_Wrd_t *__ptr;
  word *__ptr_00;
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Bit_t *pVVar3;
  
  bmcg_sat_solver_stop(p->pSat);
  __ptr = p->vInfo;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (word *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  pVVar3 = p->vUsed2;
  if (pVVar3 != (Vec_Bit_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vUsed2->pArray = (int *)0x0;
      pVVar3 = p->vUsed2;
      if (pVVar3 == (Vec_Bit_t *)0x0) goto LAB_005af6d3;
    }
    free(pVVar3);
    p->vUsed2 = (Vec_Bit_t *)0x0;
  }
LAB_005af6d3:
  pVVar3 = p->vUsed3;
  if (pVVar3 != (Vec_Bit_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vUsed3->pArray = (int *)0x0;
      pVVar3 = p->vUsed3;
      if (pVVar3 == (Vec_Bit_t *)0x0) goto LAB_005af70f;
    }
    free(pVVar3);
    p->vUsed3 = (Vec_Bit_t *)0x0;
  }
LAB_005af70f:
  pVVar1 = p->vPairs;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vMidMints;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vVarValues;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  free(p);
  return;
}

Assistant:

void Zyx_ManFree( Zyx_Man_t * p )
{
    bmcg_sat_solver_stop( p->pSat );
    Vec_WrdFree( p->vInfo );
    Vec_BitFreeP( &p->vUsed2 );
    Vec_BitFreeP( &p->vUsed3 );
    Vec_IntFree( p->vPairs );
    Vec_IntFree( p->vMidMints );
    Vec_IntFree( p->vVarValues );
    ABC_FREE( p );
}